

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProto2NamespaceEnumSpecializations
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  size_type sVar2;
  reference ppEVar3;
  int local_1c;
  int i;
  Printer *printer_local;
  FileGenerator *this_local;
  
  bVar1 = HasEnumDefinitions(this->file_);
  if (bVar1) {
    io::Printer::Print(printer,"\n#ifndef SWIG\nnamespace google {\nnamespace protobuf {\n\n");
    for (local_1c = 0;
        sVar2 = std::
                vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ::size(&this->enum_generators_), (ulong)(long)local_1c < sVar2;
        local_1c = local_1c + 1) {
      ppEVar3 = std::
                vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                ::operator[](&this->enum_generators_,(long)local_1c);
      EnumGenerator::GenerateGetEnumDescriptorSpecializations(*ppEVar3,printer);
    }
    io::Printer::Print(printer,
                       "\n}  // namespace protobuf\n}  // namespace google\n#endif  // SWIG\n");
  }
  return;
}

Assistant:

void FileGenerator::GenerateProto2NamespaceEnumSpecializations(
    io::Printer* printer) {
  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasEnumDefinitions(file_)) {
    // The SWIG conditional is to avoid a null-pointer dereference
    // (bug 1984964) in swig-1.3.21 resulting from the following syntax:
    //   namespace X { void Y<Z::W>(); }
    // which appears in GetEnumDescriptor() specializations.
    printer->Print(
        "\n"
        "#ifndef SWIG\n"
        "namespace google {\nnamespace protobuf {\n"
        "\n");
    for (int i = 0; i < enum_generators_.size(); i++) {
      enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
    }
    printer->Print(
        "\n"
        "}  // namespace protobuf\n}  // namespace google\n"
        "#endif  // SWIG\n");
  }
}